

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_val_t * mpcaf_fold_regex(int n,mpc_val_t **xs)

{
  byte bVar1;
  mpc_val_t *x;
  char *__s;
  mpc_val_t *pmVar2;
  char *pcVar3;
  char *pcVar4;
  mpc_parser_t *pmVar5;
  uint mode;
  
  x = *xs;
  __s = (char *)xs[1];
  pmVar2 = xs[2];
  pcVar3 = strchr(__s,0x6d);
  pcVar4 = strchr(__s,0x73);
  mode = (pcVar3 != (char *)0x0) + 2;
  if (pcVar4 == (char *)0x0) {
    mode = (uint)(pcVar3 != (char *)0x0);
  }
  pcVar3 = (char *)mpcf_unescape_regex(x);
  bVar1 = *(byte *)((long)pmVar2 + 0x18);
  pmVar5 = mpc_re_mode(pcVar3,mode);
  if ((bVar1 & 2) == 0) {
    pmVar5 = mpc_tok(pmVar5);
  }
  free(pcVar3);
  free(__s);
  pmVar5 = mpc_apply(pmVar5,mpcf_str_ast);
  pmVar5 = mpca_tag(pmVar5,"regex");
  pmVar5 = mpca_state(pmVar5);
  return pmVar5;
}

Assistant:

static mpc_val_t *mpcaf_fold_regex(int n, mpc_val_t **xs) {
  char *y = xs[0];
  char *m = xs[1];
  mpca_grammar_st_t *st = xs[2];
  mpc_parser_t *p;
  int mode = MPC_RE_DEFAULT;

  (void)n;
  if (strchr(m, 'm')) { mode |= MPC_RE_MULTILINE; }
  if (strchr(m, 's')) { mode |= MPC_RE_DOTALL; }
  y = mpcf_unescape_regex(y);
  p = (st->flags & MPCA_LANG_WHITESPACE_SENSITIVE) ? mpc_re_mode(y, mode) : mpc_tok(mpc_re_mode(y, mode));
  free(y);
  free(m);

  return mpca_state(mpca_tag(mpc_apply(p, mpcf_str_ast), "regex"));
}